

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_signature.c
# Opt level: O0

value signature_metadata_args(signature s)

{
  value pvVar1;
  char *str;
  value *length;
  value pvVar2;
  value *args_array;
  value args;
  value args_map;
  value in_stack_00000050;
  size_t in_stack_ffffffffffffffd8;
  value *in_stack_ffffffffffffffe0;
  signature in_stack_fffffffffffffff8;
  
  pvVar1 = signature_metadata_args_map(in_stack_fffffffffffffff8);
  if (pvVar1 == (value)0x0) {
    str = (char *)0x0;
  }
  else {
    str = (char *)value_create_array(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (str == (char *)0x0) {
      value_type_destroy(in_stack_00000050);
      str = (char *)0x0;
    }
    else {
      length = value_to_array((value)0x122d0e);
      pvVar2 = value_create_string(str,(size_t)length);
      *length = pvVar2;
      if (*length == (value)0x0) {
        value_type_destroy(in_stack_00000050);
        str = (char *)0x0;
      }
      else {
        length[1] = pvVar1;
      }
    }
  }
  return str;
}

Assistant:

value signature_metadata_args(signature s)
{
	static const char args_str[] = "args";

	value args_map = signature_metadata_args_map(s);

	if (args_map != NULL)
	{
		value args = value_create_array(NULL, 2);

		value *args_array;

		if (args == NULL)
		{
			value_type_destroy(args);

			return NULL;
		}

		args_array = value_to_array(args);

		args_array[0] = value_create_string(args_str, sizeof(args_str) - 1);

		if (args_array[0] == NULL)
		{
			value_type_destroy(args);

			return NULL;
		}

		args_array[1] = args_map;

		return args;
	}

	return NULL;
}